

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall tetgenio::load_tet(tetgenio *this,char *filebasename)

{
  size_t sVar1;
  FILE *__stream;
  tetgenio *ptVar2;
  long lVar3;
  tetgenio *ptVar4;
  int *piVar5;
  double *pdVar6;
  long lVar7;
  char *in_RCX;
  bool bVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  char *stringptr;
  FILE *local_c40;
  char infilename [1024];
  char inputline [2048];
  
  strcpy(infilename,filebasename);
  sVar1 = strlen(infilename);
  builtin_strncpy(infilename + sVar1,".ele",5);
  __stream = fopen(infilename,"r");
  if (__stream == (FILE *)0x0) {
    bVar8 = false;
  }
  else {
    pcVar10 = "Opening %s.\n";
    printf("Opening %s.\n",infilename);
    ptVar2 = (tetgenio *)readnumberline((tetgenio *)pcVar10,inputline,(FILE *)__stream,in_RCX);
    stringptr = (char *)ptVar2;
    lVar3 = strtol((char *)ptVar2,&stringptr,0);
    this->numberoftetrahedra = (int)lVar3;
    if ((int)lVar3 < 1) {
      puts("Error:  Invalid number of tetrahedra.");
      bVar8 = false;
    }
    else {
      ptVar4 = (tetgenio *)findnextnumber(ptVar2,stringptr);
      stringptr = (char *)ptVar4;
      if ((char)ptVar4->firstnumber == '\0') {
        pcVar10 = (char *)0x4;
      }
      else {
        pcVar10 = (char *)strtol((char *)ptVar4,&stringptr,0);
        ptVar2 = ptVar4;
      }
      this->numberofcorners = (int)pcVar10;
      stringptr = findnextnumber(ptVar2,stringptr);
      if (*stringptr == '\0') {
        iVar14 = 0;
      }
      else {
        lVar3 = strtol(stringptr,&stringptr,0);
        iVar14 = (int)lVar3;
      }
      this->numberoftetrahedronattributes = iVar14;
      iVar11 = this->numberofcorners;
      if ((iVar11 == 4) || (iVar11 == 10)) {
        iVar13 = this->numberoftetrahedra;
        ptVar2 = (tetgenio *)((long)(iVar11 * iVar13) * 4);
        if (iVar11 * iVar13 < 0) {
          ptVar2 = (tetgenio *)0xffffffffffffffff;
        }
        local_c40 = __stream;
        piVar5 = (int *)operator_new__((ulong)ptVar2);
        this->tetrahedronlist = piVar5;
        if (0 < iVar14) {
          ptVar2 = (tetgenio *)((long)(iVar14 * iVar13) * 8);
          if (iVar14 * iVar13 < 0) {
            ptVar2 = (tetgenio *)0xffffffffffffffff;
          }
          pdVar6 = (double *)operator_new__((ulong)ptVar2);
          this->tetrahedronattributelist = pdVar6;
        }
        lVar3 = 0;
        lVar9 = 0;
        for (iVar14 = 0; iVar14 < iVar13; iVar14 = iVar14 + 1) {
          stringptr = readnumberline(ptVar2,inputline,(FILE *)local_c40,pcVar10);
          lVar3 = (long)(int)lVar3;
          for (uVar12 = 1; (int)uVar12 + -1 < this->numberofcorners;
              uVar12 = (ulong)((int)uVar12 + 1)) {
            ptVar2 = (tetgenio *)findnextnumber(ptVar2,stringptr);
            stringptr = (char *)ptVar2;
            if ((char)ptVar2->firstnumber == '\0') {
              pcVar10 = infilename;
              printf("Error:  Tetrahedron %d is missing vertex %d in %s.\n",
                     (ulong)(uint)(this->firstnumber + iVar14),uVar12);
              terminatetetgen((tetgenmesh *)0x0,1);
            }
            lVar7 = strtol((char *)ptVar2,&stringptr,0);
            iVar11 = this->firstnumber;
            iVar13 = (int)lVar7;
            if ((iVar13 < iVar11) || (this->numberofpoints + iVar11 <= iVar13)) {
              printf("Error:  Tetrahedron %d has an invalid vertex index.\n",
                     (ulong)(uint)(iVar11 + iVar14));
              ptVar2 = (tetgenio *)0x0;
              terminatetetgen((tetgenmesh *)0x0,1);
            }
            this->tetrahedronlist[lVar3] = iVar13;
            lVar3 = lVar3 + 1;
          }
          lVar9 = (long)(int)lVar9;
          for (iVar11 = 0; iVar11 < this->numberoftetrahedronattributes; iVar11 = iVar11 + 1) {
            ptVar4 = (tetgenio *)findnextnumber(ptVar2,stringptr);
            stringptr = (char *)ptVar4;
            if ((char)ptVar4->firstnumber == '\0') {
              dVar15 = 0.0;
            }
            else {
              dVar15 = strtod((char *)ptVar4,&stringptr);
              ptVar2 = ptVar4;
            }
            this->tetrahedronattributelist[lVar9] = dVar15;
            lVar9 = lVar9 + 1;
          }
          iVar13 = this->numberoftetrahedra;
        }
        bVar8 = true;
        __stream = local_c40;
      }
      else {
        bVar8 = false;
        printf("Error:  Wrong number of corners %d (should be 4 or 10).\n");
      }
    }
    fclose(__stream);
  }
  return bVar8;
}

Assistant:

bool tetgenio::load_tet(char* filebasename)
{
  FILE *infile;
  char infilename[FILENAMESIZE];
  char inputline[INPUTLINESIZE];
  char *stringptr;
  REAL attrib;
  int corner;
  int index, attribindex;
  int i, j;

  strcpy(infilename, filebasename);
  strcat(infilename, ".ele");

  infile = fopen(infilename, "r");
  if (infile != (FILE *) NULL) {
    printf("Opening %s.\n", infilename);
  } else {
    return false;
  }

  // Read number of elements, number of corners (4 or 10), number of
  //   element attributes.
  stringptr = readnumberline(inputline, infile, infilename);
  numberoftetrahedra = (int) strtol (stringptr, &stringptr, 0);
  if (numberoftetrahedra <= 0) {
    printf("Error:  Invalid number of tetrahedra.\n");
    fclose(infile);
    return false;
  }
  stringptr = findnextnumber(stringptr);
  if (*stringptr == '\0') {
    numberofcorners = 4;  // Default read 4 nodes per element.
  } else {
    numberofcorners = (int) strtol(stringptr, &stringptr, 0);
  }
  stringptr = findnextnumber(stringptr);
  if (*stringptr == '\0') {
    numberoftetrahedronattributes = 0; // Default no attribute.
  } else {
    numberoftetrahedronattributes = (int) strtol(stringptr, &stringptr, 0);
  }
  if (numberofcorners != 4 && numberofcorners != 10) {
    printf("Error:  Wrong number of corners %d (should be 4 or 10).\n", 
           numberofcorners);
    fclose(infile);
    return false;
  }

  // Allocate memory for tetrahedra.
  tetrahedronlist = new int[numberoftetrahedra * numberofcorners]; 
  if (tetrahedronlist == (int *) NULL) {
    terminatetetgen(NULL, 1);
  }
  // Allocate memory for output tetrahedron attributes if necessary.
  if (numberoftetrahedronattributes > 0) {
    tetrahedronattributelist = new REAL[numberoftetrahedra *
                                        numberoftetrahedronattributes];
    if (tetrahedronattributelist == (REAL *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }

  // Read the list of tetrahedra.
  index = 0;
  attribindex = 0;
  for (i = 0; i < numberoftetrahedra; i++) {
    // Read tetrahedron index and the tetrahedron's corners.
    stringptr = readnumberline(inputline, infile, infilename);
    for (j = 0; j < numberofcorners; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Tetrahedron %d is missing vertex %d in %s.\n",
               i + firstnumber, j + 1, infilename);
        terminatetetgen(NULL, 1);
      }
      corner = (int) strtol(stringptr, &stringptr, 0);
      if (corner < firstnumber || corner >= numberofpoints + firstnumber) {
        printf("Error:  Tetrahedron %d has an invalid vertex index.\n",
               i + firstnumber);
        terminatetetgen(NULL, 1);
      }
      tetrahedronlist[index++] = corner;
    }
    // Read the tetrahedron's attributes.
    for (j = 0; j < numberoftetrahedronattributes; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        attrib = 0.0;
      } else {
        attrib = (REAL) strtod(stringptr, &stringptr);
      }
      tetrahedronattributelist[attribindex++] = attrib;
    }
  }

  fclose(infile);

  return true;
}